

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

void immutable::rrb_details::promote_rightmost_leaf<char,false,5>
               (ref<immutable::rrb<char,_false,_5>_> *new_rrb)

{
  uint32_t uVar1;
  ref<immutable::rrb_details::internal_node<char,_false>_> *prVar2;
  uint32_t *puVar3;
  rrb<char,_false,_5> *prVar4;
  internal_node<char,_false> *piVar5;
  ulong uVar6;
  rrb_size_table<false> *prVar7;
  uint uVar8;
  ref<immutable::rrb_details::internal_node<char,_false>_> *local_130;
  ref<immutable::rrb_details::internal_node<char,_false>_> *local_a8;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_a0;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_98;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_90;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_88;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_80;
  uint32_t local_74;
  uint local_70;
  uint32_t tail_len;
  uint32_t height;
  uint32_t shift;
  uint32_t i;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_58;
  ref<immutable::rrb_details::internal_node<char,_false>_> path [8];
  ref<immutable::rrb<char,_false,_5>_> *new_rrb_local;
  
  local_a8 = &local_58;
  do {
    ref<immutable::rrb_details::internal_node<char,_false>_>::ref(local_a8);
    local_a8 = local_a8 + 1;
  } while (local_a8 != path + 7);
  prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(new_rrb);
  ref<immutable::rrb_details::internal_node<char,false>>::operator=
            ((ref<immutable::rrb_details::internal_node<char,false>> *)&local_58,&prVar4->root);
  height = 0;
  for (tail_len = 0; uVar1 = tail_len,
      prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(new_rrb), uVar1 < prVar4->shift;
      tail_len = tail_len + 5) {
    piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       (path + ((ulong)height - 1));
    prVar2 = piVar5->child;
    piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       (path + ((ulong)height - 1));
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              (path + ((ulong)(height + 1) - 1),prVar2 + (piVar5->len - 1));
    height = height + 1;
  }
  local_70 = height;
  uVar6 = (ulong)height;
  prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(new_rrb);
  ref<immutable::rrb_details::leaf_node<char,false>>::operator=
            ((ref<immutable::rrb_details::leaf_node<char,false>> *)&prVar4->tail,path + (uVar6 - 1))
  ;
  piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                     (path + ((ulong)local_70 - 1));
  uVar1 = piVar5->len;
  prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(new_rrb);
  prVar4->tail_len = uVar1;
  prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(new_rrb);
  local_74 = prVar4->tail_len;
  ref<immutable::rrb_details::internal_node<char,_false>_>::ref
            (&local_80,(internal_node<char,_false> *)0x0);
  ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
            (path + ((ulong)local_70 - 1),&local_80);
  ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_80);
  while (uVar8 = height - 1, height != 0) {
    if (path[(ulong)height - 1].ptr == (internal_node<char,_false> *)0x0) {
      height = uVar8;
      piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         (path + ((ulong)uVar8 - 1));
      if (piVar5->len == 1) {
        ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                  (&local_88,(internal_node<char,_false> *)0x0);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  (path + ((ulong)height - 1),&local_88);
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_88);
      }
      else if ((height == 0) &&
              (piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                  (&local_58), piVar5->len == 2)) {
        piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           (path + ((ulong)height - 1));
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  (path + ((ulong)height - 1),piVar5->child);
        prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(new_rrb);
        prVar4->shift = prVar4->shift - 5;
      }
      else {
        piVar5 = internal_node_dec<char,false>(path[(ulong)height - 1].ptr);
        ref<immutable::rrb_details::internal_node<char,_false>_>::ref(&local_90,piVar5);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  (path + ((ulong)height - 1),&local_90);
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_90);
      }
    }
    else {
      height = uVar8;
      piVar5 = internal_node_clone<char,false>(path[(ulong)uVar8 - 1].ptr);
      ref<immutable::rrb_details::internal_node<char,_false>_>::ref(&local_98,piVar5);
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                (path + ((ulong)height - 1),&local_98);
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_98);
      uVar8 = height + 1;
      piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         (path + ((ulong)height - 1));
      prVar2 = piVar5->child;
      piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         (path + ((ulong)height - 1));
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                (prVar2 + (piVar5->len - 1),path + ((ulong)uVar8 - 1));
      piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         (path + ((ulong)height - 1));
      if ((piVar5->size_table).ptr != (rrb_size_table<false> *)0x0) {
        piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           (path + ((ulong)height - 1));
        prVar7 = (piVar5->size_table).ptr;
        piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           (path + ((ulong)height - 1));
        prVar7 = size_table_clone<false>(prVar7,piVar5->len);
        ref<immutable::rrb_details::rrb_size_table<false>_>::ref(&local_a0,prVar7);
        piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           (path + ((ulong)height - 1));
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar5->size_table,&local_a0);
        ref<immutable::rrb_details::rrb_size_table<false>_>::~ref(&local_a0);
        uVar1 = local_74;
        piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           (path + ((ulong)height - 1));
        prVar7 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           (&piVar5->size_table);
        puVar3 = prVar7->size;
        piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           (path + ((ulong)height - 1));
        uVar8 = piVar5->len - 1;
        puVar3[uVar8] = puVar3[uVar8] - uVar1;
      }
    }
  }
  height = uVar8;
  prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(new_rrb);
  ref<immutable::rrb_details::tree_node<char,false>>::operator=
            ((ref<immutable::rrb_details::tree_node<char,false>> *)&prVar4->root,&local_58);
  local_130 = path + 7;
  do {
    local_130 = local_130 + -1;
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(local_130);
  } while (local_130 != &local_58);
  return;
}

Assistant:

inline void promote_rightmost_leaf(ref<rrb<T, atomic_ref_counting, N>>& new_rrb)
      {
      ref<internal_node<T, atomic_ref_counting>> path[bits<N>::rrb_max_height + 1];
      path[0] = new_rrb->root;
      uint32_t i = 0, shift = 0;

      // populate path array
      for (i = 0, shift = 0; shift < new_rrb->shift; i++, shift += bits<N>::rrb_bits)
        {
        path[i + 1] = path[i]->child[path[i]->len - 1];
        }

      const uint32_t height = i;
      // Set the leaf node as tail.
      new_rrb->tail = path[height];
      new_rrb->tail_len = path[height]->len;
      const uint32_t tail_len = new_rrb->tail_len;

      // last element is now always null, in contrast to direct pop
      path[height] = ref<internal_node<T, atomic_ref_counting>>(nullptr);

      while (i-- > 0)
        {
        // TODO: First skip will always happen. Can we use that somehow?
        if (path[i + 1].ptr == nullptr)
          {
          if (path[i]->len == 1)
            {
            path[i] = ref<internal_node<T, atomic_ref_counting>>(nullptr);
            }
          else if (i == 0 && path[i]->len == 2)
            {
            path[i] = path[i]->child[0];
            new_rrb->shift -= bits<N>::rrb_bits;
            }
          else
            {
            path[i] = internal_node_dec(path[i].ptr);
            }
          }
        else
          {
          path[i] = internal_node_clone(path[i].ptr);
          path[i]->child[path[i]->len - 1] = path[i + 1];
          if (path[i]->size_table.ptr != nullptr)
            {
            path[i]->size_table = size_table_clone(path[i]->size_table.ptr, path[i]->len);
            // this line differs, as we remove `tail_len` elements from the trie,
            // instead of just 1 as in the direct pop algorithm.
            path[i]->size_table->size[path[i]->len - 1] -= tail_len;
            }
          }
        }

      new_rrb->root = path[0];
      }